

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::find_soo<std::basic_string_view<char,std::char_traits<char>>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
           *this,key_arg<std::basic_string_view<char>_> *key)

{
  bool bVar1;
  slot_type *slot;
  basic_string_view<char,_std::char_traits<char>_> *ts;
  iterator iVar2;
  EqualElement<std::basic_string_view<char,_std::char_traits<char>_>_> local_38;
  key_arg<std::basic_string_view<char>_> *local_28;
  key_arg<std::basic_string_view<char>_> *key_local;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_local;
  
  local_28 = key;
  key_local = (key_arg<std::basic_string_view<char>_> *)this;
  bVar1 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)this);
  if (!bVar1) {
    __assert_fail("is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xda7,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>, K = std::basic_string_view<char>]"
                 );
  }
  bVar1 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::empty((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)this);
  if (!bVar1) {
    local_38.rhs = local_28;
    local_38.eq = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::eq_ref((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)this);
    slot = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)this);
    ts = common_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,void>
         ::
         element<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>>
                   (slot);
    bVar1 = hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,void>
            ::
            apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>::EqualElement<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>&,absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>>
                      (&local_38,ts);
    if (bVar1) {
      iVar2 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::soo_iterator((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)this);
      return iVar2;
    }
  }
  iVar2 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::end((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)this);
  return iVar2;
}

Assistant:

iterator find_soo(const key_arg<K>& key) {
    assert(is_soo());
    return empty() || !PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                           PolicyTraits::element(soo_slot()))
               ? end()
               : soo_iterator();
  }